

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

string * fileContents(string *__return_storage_ptr__,string *fileName)

{
  streambuf *psVar1;
  stringstream local_3d8 [8];
  stringstream buffer;
  undefined1 local_3c8 [392];
  string local_240;
  undefined1 local_220 [8];
  ifstream file;
  string *fileName_local;
  
  resourcePath(&local_240,fileName);
  std::ifstream::ifstream(local_220,&local_240,8);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::stringstream::stringstream(local_3d8);
  psVar1 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_3c8,psVar1);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_3d8);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string fileContents(const std::string &fileName)
{
    std::ifstream file(resourcePath(fileName));
    std::stringstream buffer;

    buffer << file.rdbuf();

    return buffer.str();
}